

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O1

void anon_unknown.dwarf_bd91::fillChannels(Rand48 *random,FlatImageLevel *level)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  float fVar6;
  uint uVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  ostream *poVar10;
  long lVar11;
  int iVar12;
  ushort uVar13;
  float fVar14;
  double dVar15;
  
  p_Var8 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::begin();
  p_Var9 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::end();
  if (p_Var8 != p_Var9) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"             channel ",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      iVar5 = (**(code **)**(undefined8 **)(p_Var8 + 2))();
      if (iVar5 == 0) {
        lVar11 = __dynamic_cast(*(undefined8 *)(p_Var8 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                                &Imf_3_4::TypedFlatImageChannel<unsigned_int>::typeinfo,0);
        if (lVar11 == 0) goto LAB_00107e24;
        lVar3 = *(long *)(lVar11 + 8);
        iVar5 = *(int *)(lVar3 + 0x1c);
        if (iVar5 <= *(int *)(lVar3 + 0x24)) {
          iVar1 = *(int *)(lVar11 + 0x10);
          iVar2 = *(int *)(lVar11 + 0x14);
          do {
            for (iVar12 = *(int *)(lVar3 + 0x18); iVar12 <= *(int *)(lVar3 + 0x20);
                iVar12 = iVar12 + iVar1) {
              dVar15 = (double)Imath_3_2::erand48(random->_state);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar11,iVar12);
              *(int *)(*(long *)(lVar11 + 0x38) +
                      (long)(iVar12 / *(int *)(lVar11 + 0x10) +
                            (iVar5 / *(int *)(lVar11 + 0x14)) * *(int *)(lVar11 + 0x1c)) * 4) =
                   (int)(long)((1.0 - dVar15) * 0.0 + dVar15 * 100.0);
            }
            iVar5 = iVar5 + iVar2;
          } while (iVar5 <= *(int *)(lVar3 + 0x24));
        }
      }
      else if (iVar5 == 2) {
        lVar11 = __dynamic_cast(*(undefined8 *)(p_Var8 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                                &Imf_3_4::TypedFlatImageChannel<float>::typeinfo,0);
        if (lVar11 == 0) goto LAB_00107e24;
        lVar3 = *(long *)(lVar11 + 8);
        iVar5 = *(int *)(lVar3 + 0x1c);
        if (iVar5 <= *(int *)(lVar3 + 0x24)) {
          iVar1 = *(int *)(lVar11 + 0x10);
          iVar2 = *(int *)(lVar11 + 0x14);
          do {
            for (iVar12 = *(int *)(lVar3 + 0x18); iVar12 <= *(int *)(lVar3 + 0x20);
                iVar12 = iVar12 + iVar1) {
              dVar15 = (double)Imath_3_2::erand48(random->_state);
              Imf_3_4::ImageChannel::boundsCheck((int)lVar11,iVar12);
              *(float *)(*(long *)(lVar11 + 0x38) +
                        (long)(iVar12 / *(int *)(lVar11 + 0x10) +
                              (iVar5 / *(int *)(lVar11 + 0x14)) * *(int *)(lVar11 + 0x1c)) * 4) =
                   (float)((1.0 - dVar15) * 0.0 + dVar15 * 100.0);
            }
            iVar5 = iVar5 + iVar2;
          } while (iVar5 <= *(int *)(lVar3 + 0x24));
        }
      }
      else {
        if (iVar5 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                        ,0xc9,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImageLevel &)"
                       );
        }
        lVar11 = __dynamic_cast(*(undefined8 *)(p_Var8 + 2),&Imf_3_4::FlatImageChannel::typeinfo,
                                &Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::typeinfo,0);
        if (lVar11 == 0) {
LAB_00107e24:
          __cxa_bad_cast();
        }
        lVar3 = *(long *)(lVar11 + 8);
        iVar5 = *(int *)(lVar3 + 0x1c);
        if (iVar5 <= *(int *)(lVar3 + 0x24)) {
          iVar1 = *(int *)(lVar11 + 0x10);
          iVar2 = *(int *)(lVar11 + 0x14);
          do {
            for (iVar12 = *(int *)(lVar3 + 0x18); iVar12 <= *(int *)(lVar3 + 0x20);
                iVar12 = iVar12 + iVar1) {
              dVar15 = (double)Imath_3_2::erand48(random->_state);
              fVar14 = (float)((1.0 - dVar15) * 0.0 + dVar15 * 100.0);
              fVar6 = ABS(fVar14);
              uVar13 = (ushort)((uint)fVar14 >> 0x10) & 0x8000;
              if ((uint)fVar6 < 0x38800000) {
                if ((0x33000000 < (uint)fVar6) &&
                   (uVar7 = (uint)fVar6 & 0x7fffff | 0x800000, cVar4 = (char)((uint)fVar6 >> 0x17),
                   uVar13 = uVar13 | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
                   0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
                  uVar13 = uVar13 + 1;
                }
              }
              else if ((uint)fVar6 < 0x7f800000) {
                if ((uint)fVar6 < 0x477ff000) {
                  uVar13 = (ushort)((int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0)
                                   >> 0xd) | uVar13;
                }
                else {
                  uVar13 = uVar13 | 0x7c00;
                }
              }
              else {
                uVar13 = uVar13 | 0x7c00;
                if (fVar6 != INFINITY) {
                  uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
                  uVar13 = uVar13 | (ushort)uVar7 | (ushort)(uVar7 == 0);
                }
              }
              Imf_3_4::ImageChannel::boundsCheck((int)lVar11,iVar12);
              *(ushort *)
               (*(long *)(lVar11 + 0x38) +
               (long)(iVar12 / *(int *)(lVar11 + 0x10) +
                     (iVar5 / *(int *)(lVar11 + 0x14)) * *(int *)(lVar11 + 0x1c)) * 2) = uVar13;
            }
            iVar5 = iVar5 + iVar2;
          } while (iVar5 <= *(int *)(lVar3 + 0x24));
        }
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      p_Var9 = (_Rb_tree_node_base *)Imf_3_4::FlatImageLevel::end();
    } while (p_Var8 != p_Var9);
  }
  return;
}

Assistant:

void
fillChannels (Rand48& random, FlatImageLevel& level)
{
    for (FlatImageLevel::Iterator i = level.begin (); i != level.end (); ++i)
    {
        cout << "             channel " << i.name () << endl;

        switch (i.channel ().pixelType ())
        {
            case HALF: fillChannel<half> (random, i.channel ()); break;

            case FLOAT: fillChannel<float> (random, i.channel ()); break;

            case UINT: fillChannel<unsigned int> (random, i.channel ()); break;

            default: assert (false);
        }
    }
}